

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::init
          (VaryingOutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  ShaderInstancingMode SVar2;
  VaryingSource VVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VaryingOutputCountShader *this_00;
  ShaderProgramDeclaration *pSVar6;
  ostream *poVar7;
  UniformSlot *pUVar8;
  TestError *pTVar9;
  NotSupportedError *pNVar10;
  uint uVar11;
  char *pcVar12;
  bool *__s;
  char *pcVar13;
  ContextType local_51c;
  allocator<char> local_515;
  allocator<char> local_514;
  allocator<char> local_513;
  allocator<char> local_512;
  allocator<char> local_511;
  string local_510;
  FragmentOutput local_4ec;
  GLint maxComponents;
  DataType local_4c8;
  Uniform local_4c0;
  string local_498;
  GeometrySource local_478;
  string local_458;
  string local_438;
  FragmentSource local_418;
  string local_3f8;
  VertexSource local_3d8;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  GeometryToFragmentVarying local_338;
  VertexToGeometryVarying local_330;
  ostringstream buf;
  VertexAttribute local_1a8;
  VertexAttribute local_180;
  GeometryShaderDeclaration local_158;
  GLint maxTextures;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar4) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar10,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xe9a);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_test == READ_TEXTURE) {
    maxTextures = 0;
    iVar5 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar5) + 0x868))(0x8c29,&maxTextures);
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = ");
    std::ostream::operator<<(puVar1,maxTextures);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    if (maxTextures < 1) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,"Geometry shader texture units required",
                 (allocator<char> *)&maxComponents);
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&buf);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  maxTextures = 0;
  maxComponents = 0;
  iVar5 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x868))(0x8de0,&maxTextures);
  iVar5 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x868))(0x8de1,&maxComponents);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_OUTPUT_VERTICES = ");
  std::ostream::operator<<(puVar1,maxTextures);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = ");
  std::ostream::operator<<(puVar1,maxComponents);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"Components per vertex = ");
  std::ostream::operator<<(puVar1,8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  if (maxTextures < 0x100) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)",
               (allocator<char> *)&local_4c0);
    tcu::TestError::TestError(pTVar9,(string *)&buf);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (maxComponents < 0x400) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,
               "MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)",
               (allocator<char> *)&local_4c0);
    tcu::TestError::TestError(pTVar9,(string *)&buf);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar11 = (uint)maxComponents >> 3;
  if ((uint)maxTextures < (uint)maxComponents >> 3) {
    uVar11 = maxTextures;
  }
  this->m_maxEmitCount = uVar11;
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"Rendering 4 n-gons with n = ");
  std::ostream::operator<<(puVar1,6);
  std::operator<<((ostream *)puVar1,", ");
  std::ostream::operator<<(puVar1,0);
  std::operator<<((ostream *)puVar1,", ");
  std::ostream::operator<<(puVar1,this->m_maxEmitCount);
  std::operator<<((ostream *)puVar1,", and ");
  std::ostream::operator<<(puVar1,10);
  std::operator<<((ostream *)puVar1,".\n");
  std::operator<<((ostream *)puVar1,"N is supplied to the geomery shader with ");
  pcVar12 = "texture";
  if (this->m_test == READ_UNIFORM) {
    pcVar12 = "uniform";
  }
  pcVar13 = "attribute";
  if (this->m_test != READ_ATTRIBUTE) {
    pcVar13 = pcVar12;
  }
  std::operator<<((ostream *)puVar1,pcVar13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  SVar2 = this->m_mode;
  this_00 = (VaryingOutputCountShader *)operator_new(0x170);
  local_51c.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  VVar3 = this->m_test;
  iVar5 = this->m_maxEmitCount;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&maxTextures);
  std::__cxx11::string::string<std::allocator<char>>(local_358,"u_sampler",&local_511);
  std::__cxx11::string::string((string *)&maxComponents,local_358);
  local_4c8 = TYPE_SAMPLER_2D;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     ((ShaderProgramDeclaration *)&maxTextures,(Uniform *)&maxComponents);
  std::__cxx11::string::string<std::allocator<char>>(local_378,"u_emitCount",&local_512);
  std::__cxx11::string::string((string *)&local_4c0,local_378);
  local_4c0.type = TYPE_INT_VEC4;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"a_position",&local_513);
  std::__cxx11::string::string((string *)&local_180,local_398);
  local_180.type = GENERICVECTYPE_FLOAT;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_180);
  if (VVar3 < READ_LAST) {
    __s = (bool *)(&PTR_anon_var_dwarf_2064e03_01e47d30)[VVar3];
  }
  else {
    __s = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,__s,&local_514);
  std::__cxx11::string::string((string *)&local_1a8,local_3b8);
  local_1a8.type = GENERICVECTYPE_FLOAT;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_1a8);
  local_330.type = GENERICVECTYPE_FLOAT;
  local_330.flatshade = false;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_330);
  local_338.type = GENERICVECTYPE_FLOAT;
  local_338.flatshade = false;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_338);
  local_4ec.type = GENERICVECTYPE_FLOAT;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_4ec);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n");
  if (VVar3 == READ_ATTRIBUTE) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "in highp vec4 a_emitCount;\n");
    pcVar12 = "out highp vec4 v_geom_emitCount;\n";
LAB_011eb271:
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
  }
  else if (VVar3 < READ_LAST) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "in highp vec4 a_vertexNdx;\n");
    pcVar12 = "out highp vec4 v_geom_vertexNdx;\n";
    goto LAB_011eb271;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "void main (void)\n{\n\tgl_Position = a_position;\n");
  if (VVar3 == READ_ATTRIBUTE) {
    pcVar12 = "\tv_geom_emitCount = a_emitCount;\n";
LAB_011eb2ad:
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
  }
  else if (VVar3 < READ_LAST) {
    pcVar12 = "\tv_geom_vertexNdx = a_vertexNdx;\n";
    goto LAB_011eb2ad;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_3f8,&local_510,&local_51c);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_3d8,(string *)&local_3f8);
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_515);
  specializeShader(&local_438,&local_458,&local_51c);
  std::__cxx11::string::string((string *)&local_418,(string *)&local_438);
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_418);
  local_158.numOutputVertices = (size_t)iVar5;
  local_158.numInvocations = (ulong)(SVar2 == MODE_WITH_INSTANCING) * 3 + 1;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points");
  pcVar12 = glcts::fixed_sample_locations_values + 1;
  if (SVar2 == MODE_WITH_INSTANCING) {
    pcVar12 = ",invocations=4";
  }
  poVar7 = std::operator<<(poVar7,pcVar12);
  poVar7 = std::operator<<(poVar7,") in;\nlayout(triangle_strip, max_vertices = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
  std::operator<<(poVar7,") out;\n");
  pcVar12 = "in highp vec4 v_geom_vertexNdx[];\nuniform highp sampler2D u_sampler;\n";
  if (VVar3 == READ_UNIFORM) {
    pcVar12 = "in highp vec4 v_geom_vertexNdx[];\nuniform highp ivec4 u_emitCount;\n";
  }
  pcVar13 = "in highp vec4 v_geom_emitCount[];\n";
  if (VVar3 != READ_ATTRIBUTE) {
    pcVar13 = pcVar12;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar13);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "out highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n");
  if (VVar3 == READ_ATTRIBUTE) {
    poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\thighp vec4 attrEmitCounts = v_geom_emitCount[0];\n\tmediump int emitCount = int(attrEmitCounts["
                            );
    pcVar12 = "0";
    if (SVar2 == MODE_WITH_INSTANCING) {
      pcVar12 = "gl_InvocationID";
    }
    poVar7 = std::operator<<(poVar7,pcVar12);
    std::operator<<(poVar7,"]);\n");
    pcVar12 = 
    "\thighp vec4 color = vec4((emitCount < 10) ? (0.0) : (1.0), (emitCount > 10) ? (0.0) : (1.0), 1.0, 1.0);\n"
    ;
  }
  else {
    if (VVar3 == READ_TEXTURE) {
      poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\thighp float primitiveNdx = ");
      pcVar12 = "v_geom_vertexNdx[0].x";
      if (SVar2 == MODE_WITH_INSTANCING) {
        pcVar12 = "float(gl_InvocationID)";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      poVar7 = std::operator<<(poVar7,
                               ";\n\thighp vec2 texCoord = vec2(1.0 / 8.0 + primitiveNdx / 4.0, 0.5);\n\thighp vec4 texColor = texture(u_sampler, texCoord);\n\tmediump int emitCount = 0;\n\tif (texColor.x > 0.0)\n\t\temitCount += "
                              );
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,6);
      poVar7 = std::operator<<(poVar7,";\n\tif (texColor.y > 0.0)\n\t\temitCount += ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
      poVar7 = std::operator<<(poVar7,";\n\tif (texColor.z > 0.0)\n\t\temitCount += ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      poVar7 = std::operator<<(poVar7,";\n\tif (texColor.w > 0.0)\n\t\temitCount += ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,10);
      pcVar12 = ";\n";
    }
    else {
      if (VVar3 != READ_UNIFORM) goto LAB_011eb5d4;
      poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tmediump int primitiveNdx = ");
      pcVar12 = "int(v_geom_vertexNdx[0].x)";
      if (SVar2 == MODE_WITH_INSTANCING) {
        pcVar12 = "gl_InvocationID";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      pcVar12 = ";\n\tmediump int emitCount = u_emitCount[primitiveNdx];\n";
    }
    std::operator<<(poVar7,pcVar12);
    pcVar12 = 
    "\n\tconst highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n\thighp vec4 color = colors[int(primitiveNdx)];\n"
    ;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
LAB_011eb5d4:
  poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\n\thighp vec4 basePos = ");
  pcVar12 = "gl_in[0].gl_Position";
  if (SVar2 == MODE_WITH_INSTANCING) {
    pcVar12 = 
    "gl_in[0].gl_Position + 0.5 * vec4(cos(float(gl_InvocationID)), sin(float(gl_InvocationID)), 0.0, 0.0)"
    ;
  }
  poVar7 = std::operator<<(poVar7,pcVar12);
  std::operator<<(poVar7,
                  ";\n\tfor (mediump int i = 0; i < emitCount / 2; i++)\n\t{\n\t\thighp float angle = (float(i) + 0.5) / float(emitCount / 2) * 3.142;\n\t\tgl_Position = basePos + vec4(cos(angle),  sin(angle), 0.0, 0.0) * 0.15;\n\t\tv_frag_FragColor = color;\n\t\tEmitVertex();\n\t\tgl_Position = basePos + vec4(cos(angle), -sin(angle), 0.0, 0.0) * 0.15;\n\t\tv_frag_FragColor = color;\n\t\tEmitVertex();\n\t}}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_498,&local_510,&local_51c);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_478,(string *)&local_498);
  pSVar6 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar6,&local_478);
  sglr::ShaderProgram::ShaderProgram((ShaderProgram *)this_00,pSVar6);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string((string *)&maxComponents);
  std::__cxx11::string::~string(local_358);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&maxTextures);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e47570;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e475a8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e475c0;
  *(VaryingSource *)&(this_00->super_ShaderProgram).field_0x154 = VVar3;
  pUVar8 = sglr::ShaderProgram::getUniformByName((ShaderProgram *)this_00,"u_sampler");
  this_00->m_sampler = pUVar8;
  pcVar12 = "u_emitCount";
  pUVar8 = sglr::ShaderProgram::getUniformByName((ShaderProgram *)this_00,"u_emitCount");
  this_00->m_emitCount = pUVar8;
  this_00->m_maxEmitCount = iVar5;
  this_00->m_instanced = SVar2 == MODE_WITH_INSTANCING;
  this->m_program = this_00;
  iVar5 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pcVar12);
  return iVar5;
}

Assistant:

void VaryingOutputCountCase::init (void)
{
	// Check requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_test == VaryingOutputCountShader::READ_TEXTURE)
	{
		glw::GLint maxTextures = 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &maxTextures);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = " << maxTextures << tcu::TestLog::EndMessage;

		if (maxTextures < 1)
			throw tcu::NotSupportedError("Geometry shader texture units required");
	}

	// Get max emit count
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (maxVertices < 256)
			throw tcu::TestError("MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)");
		if (maxComponents < 1024)
			throw tcu::TestError("MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)");

		m_maxEmitCount = de::min(maxVertices, maxComponents / componentsPerVertex);
	}

	// Log what the test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering 4 n-gons with n = "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_0)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_1)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_2)) << ", and "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_3)) << ".\n"
		<< "N is supplied to the geomery shader with "
		<< ((m_test == VaryingOutputCountShader::READ_ATTRIBUTE) ? ("attribute") : (m_test == VaryingOutputCountShader::READ_UNIFORM) ? ("uniform") : ("texture"))
		<< tcu::TestLog::EndMessage;

	// Gen shader
	{
		const bool instanced = (m_mode == MODE_WITH_INSTANCING);

		DE_ASSERT(!m_program);
		m_program = new VaryingOutputCountShader(m_context.getRenderContext().getType(), m_test, m_maxEmitCount, instanced);
	}

	// Case init
	GeometryShaderRenderTest::init();
}